

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Performance::mandelbrotFragmentTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,int numFractalIterations)

{
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined1 local_15;
  int local_14;
  string *psStack_10;
  int numFractalIterations_local;
  string *resultTemplate;
  
  local_14 = (int)this;
  local_15 = 0;
  psStack_10 = __return_storage_ptr__;
  de::toString<int>(&local_58,&local_14);
  std::operator+(&local_38,
                 "#version 300 es\nlayout(location = 0) out mediump vec4 o_color;\nin mediump vec2 v_coord${NAME_SPEC};\n\nprecision mediump float;\n\n#define NUM_ITERS "
                 ,&local_58);
  std::operator+(__return_storage_ptr__,&local_38,
                 "\n\nvoid main (void)\n{\n\tvec2 coords = v_coord${NAME_SPEC};\n\tfloat u_limit = 2.0 * 2.0;\n\tvec2 tmp = vec2(0, 0);\n\tint iter;\n\n\tfor (iter = 0; iter < NUM_ITERS; iter++)\n\t{\n\t\ttmp = vec2((tmp.x + tmp.y) * (tmp.x - tmp.y), 2.0 * (tmp.x * tmp.y)) + coords;\n\n\t\tif (dot(tmp, tmp) > u_limit)\n\t\t\tbreak;\n\t}\n\n\tvec3 color = vec3(float(iter) * (1.0 / float(NUM_ITERS)));\n\n\to_color = vec4(color, 1.0) + ${FLOAT01};\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
                );
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

static string mandelbrotFragmentTemplate (int numFractalIterations)
{
	string resultTemplate =
		"#version 300 es\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"in mediump vec2 v_coord${NAME_SPEC};\n"
		"\n"
		"precision mediump float;\n"
		"\n"
		"#define NUM_ITERS " + de::toString(numFractalIterations) + "\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	vec2 coords = v_coord${NAME_SPEC};\n"
		"	float u_limit = 2.0 * 2.0;\n"
		"	vec2 tmp = vec2(0, 0);\n"
		"	int iter;\n"
		"\n"
		"	for (iter = 0; iter < NUM_ITERS; iter++)\n"
		"	{\n"
		"		tmp = vec2((tmp.x + tmp.y) * (tmp.x - tmp.y), 2.0 * (tmp.x * tmp.y)) + coords;\n"
		"\n"
		"		if (dot(tmp, tmp) > u_limit)\n"
		"			break;\n"
		"	}\n"
		"\n"
		"	vec3 color = vec3(float(iter) * (1.0 / float(NUM_ITERS)));\n"
		"\n"
		"	o_color = vec4(color, 1.0) + ${FLOAT01};\n"
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}